

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtxParam_getParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,uint *value)

{
  uint uVar1;
  ZSTD_format_e ZVar2;
  size_t sVar3;
  
  sVar3 = 0xffffffffffffffd8;
  if ((int)param < 0xa0) {
    switch(param) {
    case ZSTD_p_compressionLevel:
      ZVar2 = CCtxParams->compressionLevel;
      break;
    case ZSTD_p_windowLog:
      ZVar2 = (CCtxParams->cParams).windowLog;
      break;
    case ZSTD_p_hashLog:
      ZVar2 = (CCtxParams->cParams).hashLog;
      break;
    case ZSTD_p_chainLog:
      ZVar2 = (CCtxParams->cParams).chainLog;
      break;
    case ZSTD_p_searchLog:
      ZVar2 = (CCtxParams->cParams).searchLog;
      break;
    case ZSTD_p_minMatch:
      ZVar2 = (CCtxParams->cParams).searchLength;
      break;
    case ZSTD_p_targetLength:
      ZVar2 = (CCtxParams->cParams).targetLength;
      break;
    case ZSTD_p_compressionStrategy:
      ZVar2 = (CCtxParams->cParams).strategy;
      break;
    default:
      if (param != ZSTD_p_format) {
        return 0xffffffffffffffd8;
      }
      ZVar2 = CCtxParams->format;
    }
  }
  else if ((int)param < 200) {
    switch(param) {
    case ZSTD_p_enableLongDistanceMatching:
      ZVar2 = (CCtxParams->ldmParams).enableLdm;
      break;
    case ZSTD_p_ldmHashLog:
      ZVar2 = (CCtxParams->ldmParams).hashLog;
      break;
    case ZSTD_p_ldmMinMatch:
      ZVar2 = (CCtxParams->ldmParams).minMatchLength;
      break;
    case ZSTD_p_ldmBucketSizeLog:
      ZVar2 = (CCtxParams->ldmParams).bucketSizeLog;
      break;
    case ZSTD_p_ldmHashEveryLog:
      ZVar2 = (CCtxParams->ldmParams).hashEveryLog;
      break;
    default:
      goto switchD_00180b87_default;
    }
  }
  else if ((int)param < 400) {
    if (param == ZSTD_p_contentSizeFlag) {
      ZVar2 = (CCtxParams->fParams).contentSizeFlag;
    }
    else if (param == ZSTD_p_checksumFlag) {
      ZVar2 = (CCtxParams->fParams).checksumFlag;
    }
    else {
      if (param != ZSTD_p_dictIDFlag) {
        return 0xffffffffffffffd8;
      }
      uVar1 = (CCtxParams->fParams).noDictIDFlag;
LAB_00180bbf:
      ZVar2 = (ZSTD_format_e)(uVar1 == 0);
    }
  }
  else if (param == ZSTD_p_nbWorkers) {
    ZVar2 = CCtxParams->nbWorkers;
  }
  else {
    if (param == ZSTD_p_compressLiterals) {
      uVar1 = CCtxParams->disableLiteralCompression;
      goto LAB_00180bbf;
    }
    if (param != ZSTD_p_forceMaxWindow) {
      return 0xffffffffffffffd8;
    }
    ZVar2 = CCtxParams->forceWindow;
  }
  *value = ZVar2;
  sVar3 = 0;
switchD_00180b87_default:
  return sVar3;
}

Assistant:

size_t ZSTD_CCtxParam_getParameter(
        ZSTD_CCtx_params* CCtxParams, ZSTD_cParameter param, unsigned* value)
{
    switch(param)
    {
    case ZSTD_p_format :
        *value = CCtxParams->format;
        break;
    case ZSTD_p_compressionLevel :
        *value = CCtxParams->compressionLevel;
        break;
    case ZSTD_p_windowLog :
        *value = CCtxParams->cParams.windowLog;
        break;
    case ZSTD_p_hashLog :
        *value = CCtxParams->cParams.hashLog;
        break;
    case ZSTD_p_chainLog :
        *value = CCtxParams->cParams.chainLog;
        break;
    case ZSTD_p_searchLog :
        *value = CCtxParams->cParams.searchLog;
        break;
    case ZSTD_p_minMatch :
        *value = CCtxParams->cParams.searchLength;
        break;
    case ZSTD_p_targetLength :
        *value = CCtxParams->cParams.targetLength;
        break;
    case ZSTD_p_compressionStrategy :
        *value = (unsigned)CCtxParams->cParams.strategy;
        break;
    case ZSTD_p_compressLiterals:
        *value = !CCtxParams->disableLiteralCompression;
        break;
    case ZSTD_p_contentSizeFlag :
        *value = CCtxParams->fParams.contentSizeFlag;
        break;
    case ZSTD_p_checksumFlag :
        *value = CCtxParams->fParams.checksumFlag;
        break;
    case ZSTD_p_dictIDFlag :
        *value = !CCtxParams->fParams.noDictIDFlag;
        break;
    case ZSTD_p_forceMaxWindow :
        *value = CCtxParams->forceWindow;
        break;
    case ZSTD_p_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        assert(CCtxParams->nbWorkers == 0);
#endif
        *value = CCtxParams->nbWorkers;
        break;
    case ZSTD_p_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        *value = CCtxParams->jobSize;
        break;
#endif
    case ZSTD_p_overlapSizeLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        *value = CCtxParams->overlapSizeLog;
        break;
#endif
    case ZSTD_p_enableLongDistanceMatching :
        *value = CCtxParams->ldmParams.enableLdm;
        break;
    case ZSTD_p_ldmHashLog :
        *value = CCtxParams->ldmParams.hashLog;
        break;
    case ZSTD_p_ldmMinMatch :
        *value = CCtxParams->ldmParams.minMatchLength;
        break;
    case ZSTD_p_ldmBucketSizeLog :
        *value = CCtxParams->ldmParams.bucketSizeLog;
        break;
    case ZSTD_p_ldmHashEveryLog :
        *value = CCtxParams->ldmParams.hashEveryLog;
        break;
    default: return ERROR(parameter_unsupported);
    }
    return 0;
}